

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O2

bool libcellml::traverseComponentEntityTreeLinkingUnits
               (ComponentEntityPtr *componentEntity,DescriptionList *descriptionList)

{
  bool bVar1;
  bool bVar2;
  size_t sVar3;
  ulong uVar4;
  shared_ptr<libcellml::Component> component;
  ComponentPtr c;
  ComponentPtr local_60;
  __shared_ptr<libcellml::ComponentEntity,(__gnu_cxx::_Lock_policy)2> local_50 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  std::dynamic_pointer_cast<libcellml::Component,libcellml::ComponentEntity>
            ((shared_ptr<libcellml::ComponentEntity> *)&local_60);
  if (local_60.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    bVar1 = true;
  }
  else {
    bVar1 = linkComponentVariableUnits(&local_60,descriptionList);
  }
  uVar4 = 0;
  while( true ) {
    sVar3 = ComponentEntity::componentCount
                      ((componentEntity->
                       super___shared_ptr<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr);
    if (sVar3 <= uVar4) break;
    ComponentEntity::component
              ((ComponentEntity *)&local_40,
               (size_t)(componentEntity->
                       super___shared_ptr<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr);
    std::__shared_ptr<libcellml::ComponentEntity,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<libcellml::Component,void>(local_50,&local_40);
    bVar2 = traverseComponentEntityTreeLinkingUnits((ComponentEntityPtr *)local_50,descriptionList);
    bVar1 = (bool)(bVar1 & bVar2);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    uVar4 = uVar4 + 1;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_60.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return bVar1;
}

Assistant:

bool traverseComponentEntityTreeLinkingUnits(const ComponentEntityPtr &componentEntity, DescriptionList &descriptionList)
{
    auto component = std::dynamic_pointer_cast<Component>(componentEntity);
    bool status = (component != nullptr) ?
                      linkComponentVariableUnits(component, descriptionList) :
                      true;
    for (size_t index = 0; index < componentEntity->componentCount(); ++index) {
        auto c = componentEntity->component(index);
        status = traverseComponentEntityTreeLinkingUnits(c, descriptionList) && status;
    }
    return status;
}